

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void norm_3d(float32 ***arr,uint32 d1,uint32 d2,uint32 d3)

{
  float32 *pfVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  
  if (d1 != 0) {
    uVar3 = 0;
    do {
      if (d2 != 0) {
        uVar4 = 0;
        do {
          if (d3 == 0) {
            dVar5 = 0.0;
          }
          else {
            dVar5 = 0.0;
            uVar2 = 0;
            do {
              dVar5 = dVar5 + (double)(float)arr[uVar3][uVar4][uVar2];
              uVar2 = uVar2 + 1;
            } while (d3 != uVar2);
          }
          if (d3 != 0) {
            pfVar1 = arr[uVar3][uVar4];
            uVar2 = 0;
            do {
              pfVar1[uVar2] = (float32)(float)((double)(float)pfVar1[uVar2] * (1.0 / dVar5));
              uVar2 = uVar2 + 1;
            } while (d3 != uVar2);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != d2);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != d1);
  }
  return;
}

Assistant:

void
norm_3d(float32 ***arr,
	uint32 d1,
	uint32 d2,
	uint32 d3)
{
    uint32 i, j, k;
    float64 s;

    for (i = 0; i < d1; i++) {
	for (j = 0; j < d2; j++) {

	    /* compute sum (i, j) as over all k */
	    for (k = 0, s = 0; k < d3; k++) {
		s += arr[i][j][k];
	    }

	    /* do 1 floating point divide */
	    s = 1.0 / s;

	    /* divide all k by sum over k */
	    for (k = 0; k < d3; k++) {
		arr[i][j][k] *= s;
	    }
	}
    }
}